

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::sort<unsigned_int,reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  undefined4 uVar1;
  reduceDB_lt lt_00;
  bool bVar2;
  int in_ESI;
  reduceDB_lt in_RDI;
  int j;
  int i;
  uint tmp;
  uint pivot;
  undefined8 in_stack_ffffffffffffffc0;
  uint *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  undefined8 in_stack_ffffffffffffffe0;
  int size_00;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar4;
  
  if (in_ESI < 0x10) {
    lt_00.ca._4_4_ = in_stack_ffffffffffffffd4;
    lt_00.ca._0_4_ = in_stack_ffffffffffffffd0;
    selectionSort<unsigned_int,reduceDB_lt>
              (in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),lt_00);
  }
  else {
    iVar3 = -1;
    iVar4 = in_ESI;
    while( true ) {
      do {
        iVar3 = iVar3 + 1;
        bVar2 = reduceDB_lt::operator()
                          ((reduceDB_lt *)CONCAT44(iVar3,in_ESI),
                           (CRef)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                           (CRef)in_stack_ffffffffffffffc8);
      } while (bVar2);
      do {
        in_ESI = in_ESI + -1;
        bVar2 = reduceDB_lt::operator()
                          ((reduceDB_lt *)CONCAT44(iVar3,in_ESI),
                           (CRef)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                           (CRef)in_stack_ffffffffffffffc8);
        size_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
      } while (bVar2);
      if (in_ESI <= iVar3) break;
      uVar1 = *(undefined4 *)((long)&((in_RDI.ca)->ra).memory + (long)iVar3 * 4);
      *(undefined4 *)((long)&((in_RDI.ca)->ra).memory + (long)iVar3 * 4) =
           *(undefined4 *)((long)&((in_RDI.ca)->ra).memory + (long)in_ESI * 4);
      *(undefined4 *)((long)&((in_RDI.ca)->ra).memory + (long)in_ESI * 4) = uVar1;
    }
    sort<unsigned_int,reduceDB_lt>((uint *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),size_00,in_RDI)
    ;
    sort<unsigned_int,reduceDB_lt>((uint *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),size_00,in_RDI)
    ;
  }
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}